

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this)

{
  IfcLightSource::~IfcLightSource(&this->super_IfcLightSource,&PTR_construction_vtable_24__008320c0)
  ;
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}